

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O0

bool __thiscall lattice::supercell::within_supercell(supercell *this,offset_t *cell)

{
  DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>,_0>
  *in_RDI;
  CoeffReturnType CVar1;
  size_t m;
  bool res;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>
  p;
  double eps;
  Index in_stack_ffffffffffffff98;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>_>
  *in_stack_ffffffffffffffb0;
  ulong uVar2;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  byte bVar3;
  
  Eigen::DenseBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::cast<double>
            ((DenseBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)
             CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0
            );
  bVar3 = 1;
  uVar2 = 0;
  do {
    if (*(ulong *)in_RDI <= uVar2) {
      return (bool)(bVar3 & 1);
    }
    CVar1 = Eigen::
            DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>,_0>,_0>
            ::operator()(in_RDI,in_stack_ffffffffffffff98);
    if (CVar1 < -1e-08) {
LAB_001170cc:
      bVar3 = 0;
    }
    else {
      CVar1 = Eigen::
              DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>,_0>,_0>
              ::operator()(in_RDI,in_stack_ffffffffffffff98);
      if (0.99999999 < CVar1) goto LAB_001170cc;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool within_supercell(const offset_t& cell) const {
    const double eps = 1.0e-8;
    auto p = rs_ * cell.cast<double>();
    bool res = true;
    for (std::size_t m = 0; m < dim_; ++m) {
      if (p(m) < -eps || p(m) > (1.0 - eps)) res = false;
    }
    return res;
  }